

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSimpleRecurrentLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t uVar1;
  uint64 uVar2;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  WeightParamType WVar6;
  WeightParamType WVar7;
  WeightParamType WVar8;
  SimpleRecurrentLayerParams *pSVar9;
  ActivationParams *params;
  WeightParams *pWVar10;
  allocator local_ea;
  allocator local_e9;
  undefined1 local_e8 [40];
  string err;
  Result r;
  string local_78;
  string *local_58;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)local_e8,layer,2,2);
  Result::operator=(&r,(Result *)local_e8);
  std::__cxx11::string::~string((string *)(local_e8 + 8));
  bVar4 = Result::good(&r);
  if (bVar4) {
    validateOutputCount((Result *)local_e8,layer,2,2);
    Result::operator=(&r,(Result *)local_e8);
    std::__cxx11::string::~string((string *)(local_e8 + 8));
  }
  bVar4 = Result::good(&r);
  if (bVar4) {
    bVar4 = Result::good(&r);
    if (bVar4) {
      if (this->ndArrayInterpretation != true) {
LAB_005939e3:
        pSVar9 = Specification::NeuralNetworkLayer::simplerecurrent(layer);
        pWVar10 = pSVar9->weightmatrix_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        bVar4 = pSVar9->hasbiasvector_;
        WVar6 = valueType(pWVar10);
        pWVar10 = pSVar9->recursionmatrix_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar7 = valueType(pWVar10);
        pWVar10 = pSVar9->biasvector_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar8 = valueType(pWVar10);
        if (((WVar6 == UNSPECIFIED) || (WVar7 == UNSPECIFIED)) ||
           ((WVar8 == UNSPECIFIED & bVar4) != 0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,"Simple recurrent layer \'",(layer->name_).ptr_);
          std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e8,"\' has invalid weightMatrix/recusionMatrix/Bias fields.");
          std::__cxx11::string::~string((string *)local_e8);
          Result::Result((Result *)local_e8,INVALID_MODEL_PARAMETERS,&err);
        }
        else {
          if (((WVar6 == QUINT) || (WVar7 == QUINT)) ||
             ((WVar6 == WVar7 && (((WVar6 != WVar8 && WVar8 != QUINT) & bVar4) != 1)))) {
            uVar1 = pSVar9->outputvectorsize_;
            pWVar10 = pSVar9->weightmatrix_;
            if (pWVar10 == (WeightParams *)0x0) {
              pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            uVar2 = pSVar9->inputvectorsize_;
            std::__cxx11::string::string((string *)&err,"SimpleRNN",&local_e9);
            local_58 = (layer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_78,"WeightMatrix",&local_ea);
            validateGeneralWeightParams
                      ((Result *)local_e8,pWVar10,uVar2 * uVar1,uVar1,&err,local_58,&local_78);
            Result::operator=(&r,(Result *)local_e8);
            std::__cxx11::string::~string((string *)(local_e8 + 8));
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&err);
            bVar5 = Result::good(&r);
            if (bVar5) {
              pWVar10 = pSVar9->recursionmatrix_;
              if (pWVar10 == (WeightParams *)0x0) {
                pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              uVar1 = pSVar9->outputvectorsize_;
              std::__cxx11::string::string((string *)&err,"SimpleRNN",&local_e9);
              psVar3 = (layer->name_).ptr_;
              std::__cxx11::string::string((string *)&local_78,"RecursionMatrix",&local_ea);
              validateGeneralWeightParams
                        ((Result *)local_e8,pWVar10,uVar1 * uVar1,uVar1,&err,psVar3,&local_78);
              Result::operator=(&r,(Result *)local_e8);
              std::__cxx11::string::~string((string *)(local_e8 + 8));
              std::__cxx11::string::~string((string *)&local_78);
              std::__cxx11::string::~string((string *)&err);
              bVar5 = Result::good(&r);
              if (bVar5) {
                if (bVar4 != false) {
                  pWVar10 = pSVar9->biasvector_;
                  if (pWVar10 == (WeightParams *)0x0) {
                    pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  uVar1 = pSVar9->outputvectorsize_;
                  std::__cxx11::string::string((string *)&err,"SimpleRNN",&local_e9);
                  psVar3 = (layer->name_).ptr_;
                  std::__cxx11::string::string((string *)&local_78,"BiasVector",&local_ea);
                  validateGeneralWeightParams
                            ((Result *)local_e8,pWVar10,uVar1,1,&err,psVar3,&local_78);
                  Result::operator=(&r,(Result *)local_e8);
                  std::__cxx11::string::~string((string *)(local_e8 + 8));
                  std::__cxx11::string::~string((string *)&local_78);
                  std::__cxx11::string::~string((string *)&err);
                  bVar4 = Result::good(&r);
                  if (!bVar4) goto LAB_00593da0;
                }
                pSVar9 = Specification::NeuralNetworkLayer::simplerecurrent(layer);
                params = pSVar9->activation_;
                if (params == (ActivationParams *)0x0) {
                  params = (ActivationParams *)&Specification::_ActivationParams_default_instance_;
                }
                validateRecurrentActivationParams(__return_storage_ptr__,params);
                goto LAB_00593dad;
              }
            }
            goto LAB_00593da0;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,"Simple recurrent layer \'",(layer->name_).ptr_);
          std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e8,
                         "\' has invalid weightMatrix/recusionMatrix/Bias fields. Field value types should match and should either be half or full precision."
                        );
          std::__cxx11::string::~string((string *)local_e8);
          Result::Result((Result *)local_e8,INVALID_MODEL_PARAMETERS,&err);
        }
        Result::operator=(&r,(Result *)local_e8);
        std::__cxx11::string::~string((string *)(local_e8 + 8));
        Result::Result(__return_storage_ptr__,&r);
        std::__cxx11::string::~string((string *)&err);
        goto LAB_00593dad;
      }
      std::__cxx11::string::string((string *)&local_50,"SimpleRecurrent",(allocator *)&err);
      validateInputOutputRankEquality((Result *)local_e8,layer,&local_50,&this->blobNameToRank);
      Result::operator=(&r,(Result *)local_e8);
      std::__cxx11::string::~string((string *)(local_e8 + 8));
      std::__cxx11::string::~string((string *)&local_50);
      bVar4 = Result::good(&r);
      if (bVar4) {
        std::__cxx11::string::string((string *)&err,"SimpleRecurrent",(allocator *)&local_78);
        validateRankCount((Result *)local_e8,layer,&err,5,5,&this->blobNameToRank);
        Result::operator=(&r,(Result *)local_e8);
        std::__cxx11::string::~string((string *)(local_e8 + 8));
        std::__cxx11::string::~string((string *)&err);
        bVar4 = Result::good(&r);
        if (bVar4) goto LAB_005939e3;
      }
    }
  }
LAB_00593da0:
  Result::Result(__return_storage_ptr__,&r);
LAB_00593dad:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    // Must specify hidden state
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 2, 2);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "SimpleRecurrent", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "SimpleRecurrent", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.simplerecurrent();
    bool hasBiasVector = params.hasbiasvector();
    WeightParamType weightMatrixValueType, recursionMatrixValueType, biasVectorValueType;
    weightMatrixValueType = valueType(params.weightmatrix());
    recursionMatrixValueType = valueType(params.recursionmatrix());
    biasVectorValueType = valueType(params.biasvector());

    // Verify all weights are of valid type
    if((weightMatrixValueType == UNSPECIFIED) || recursionMatrixValueType == UNSPECIFIED || (hasBiasVector && biasVectorValueType == UNSPECIFIED)){
        std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    // Verify either weightMatrix, recursionMatrix, and biasVector are all FP32 or FP16, or one of them is quantized
    if (weightMatrixValueType != QUINT && recursionMatrixValueType != QUINT){
        if (weightMatrixValueType != recursionMatrixValueType ||
            (hasBiasVector && biasVectorValueType != QUINT && weightMatrixValueType != biasVectorValueType) ){
            std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields. "
            "Field value types should match and should either be half or full precision.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    // Check weight matrix size
    // input matrix
    uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.weightmatrix(), input_matrix_size,
                                    params.outputvectorsize(),
                                    "SimpleRNN", layer.name(), "WeightMatrix");
    if (!r.good()) return r;
    // recurrent matrix
    uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.recursionmatrix(), recurrent_matrix_size,
                                    params.outputvectorsize(), "SimpleRNN",
                                    layer.name(), "RecursionMatrix");
    if (!r.good()) return r;
    // bias
    if (hasBiasVector){
        r = validateGeneralWeightParams(params.biasvector(), params.outputvectorsize(), 1,
                                        "SimpleRNN", layer.name(), "BiasVector");
        if (!r.good()) return r;
    }
    // Validate the activations as well
    return validateRecurrentActivationParams(layer.simplerecurrent().activation());

}